

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeCachePref(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  int32_t iVar1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint Reg;
  uint Base;
  uint Hint;
  int Offset;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  iVar1 = SignExtend32(Insn & 0xffff,0x10);
  uVar2 = fieldFromInstruction(Insn,0x10,5);
  RegNo = fieldFromInstruction(Insn,0x15,5);
  Reg = getReg(Decoder,8,RegNo);
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateImm0(Inst,(long)iVar1);
  MCOperand_CreateImm0(Inst,(ulong)uVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeCachePref(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Hint = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);
	MCOperand_CreateImm0(Inst, Hint);

	return MCDisassembler_Success;
}